

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_3_3::anon_unknown_5::DefaultThreadPoolProvider::threadLoop
          (DefaultThreadPoolProvider *this,
          shared_ptr<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData> *data)

{
  bool bVar1;
  element_type *peVar2;
  unique_lock<std::mutex> *in_RSI;
  Task *task;
  unique_lock<std::mutex> taskLock;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  unique_lock<std::mutex> *this_00;
  int local_38;
  vector<IlmThread_3_3::Task_*,_std::allocator<IlmThread_3_3::Task_*>_> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RSI;
  do {
    peVar2 = std::
             __shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1eed);
    Semaphore::wait(&peVar2->_taskSemaphore,in_RSI);
    peVar2 = std::
             __shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1eff);
    in_RSI = (unique_lock<std::mutex> *)&peVar2->_taskMutex;
    std::unique_lock<std::mutex>::unique_lock
              (this_00,(mutex_type *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    std::
    __shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1e1f1a);
    bVar1 = std::vector<IlmThread_3_3::Task_*,_std::allocator<IlmThread_3_3::Task_*>_>::empty
                      (in_stack_ffffffffffffffd0);
    if (bVar1) {
      std::
      __shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e1f9c);
      in_stack_ffffffffffffffbf = DefaultThreadPoolData::stopped((DefaultThreadPoolData *)0x1e1fa4);
      if (!(bool)in_stack_ffffffffffffffbf) goto LAB_001e1fc0;
      local_38 = 3;
    }
    else {
      std::
      __shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e1f34);
      std::vector<IlmThread_3_3::Task_*,_std::allocator<IlmThread_3_3::Task_*>_>::back
                ((vector<IlmThread_3_3::Task_*,_std::allocator<IlmThread_3_3::Task_*>_> *)this_00);
      std::
      __shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<IlmThread_3_3::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e1f52);
      std::vector<IlmThread_3_3::Task_*,_std::allocator<IlmThread_3_3::Task_*>_>::pop_back
                ((vector<IlmThread_3_3::Task_*,_std::allocator<IlmThread_3_3::Task_*>_> *)0x1e1f5e);
      std::unique_lock<std::mutex>::unlock(this_00);
      handleProcessTask((Task *)this_00);
LAB_001e1fc0:
      local_38 = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    if (local_38 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void
DefaultThreadPoolProvider::threadLoop (
    std::shared_ptr<DefaultThreadPoolData> data)
{
    while (true)
    {
        //
        // Wait for a task to become available
        //

        data->_taskSemaphore.wait ();

        {
            std::unique_lock<std::mutex> taskLock (data->_taskMutex);

            //
            // If there is a task pending, pop off the next task in the FIFO
            //

            if (!data->_tasks.empty ())
            {
                Task* task = data->_tasks.back ();
                data->_tasks.pop_back ();

                // release the mutex while we process
                taskLock.unlock ();

                handleProcessTask (task);

                // do not need to reacquire the lock at all since we
                // will just loop around, pull any other task
            }
            else if (data->stopped ()) { break; }
        }
    }
}